

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void rgbaInterfaceTiledExamples(void)

{
  ostream *poVar1;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Rgba *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  int in_stack_00000048;
  int in_stack_0000004c;
  char *in_stack_00000050;
  Array2D<Imf_2_5::Rgba> pixels;
  int h;
  int w;
  int th;
  int tw;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  Array2D<Imf_2_5::Rgba> *this;
  Rgba *in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  undefined4 uVar4;
  int tileHeight;
  int tileWidth;
  
  this = (Array2D<Imf_2_5::Rgba> *)&std::cout;
  poVar1 = std::operator<<((ostream *)&std::cout,"\nRGBA tiled images\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  tileWidth = 100;
  tileHeight = 0x4b;
  uVar4 = 600;
  uVar3 = 400;
  poVar1 = std::operator<<((ostream *)this,"writing tiled image with image-size framebuffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
  ;
  uVar2 = 0;
  drawImage3(in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
             (int)in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,(int)in_stack_ffffffffffffffa0
             ,(int)in_stack_ffffffffffffffa8,(int)this);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&stack0xffffffffffffffd8,0);
  writeTiledRgbaONE1(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,tileWidth,
                     tileHeight);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing tiled image with tile-size framebuffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  writeTiledRgbaONE2((char *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_0000002c,
                     in_stack_00000028,in_stack_00000024,in_stack_00000020);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled mipmap image with image-size framebuffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  writeTiledRgbaMIP1((char *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_0000002c,
                     in_stack_00000028,in_stack_00000024,in_stack_00000020);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled mipmap image with tile-size framebuffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  writeTiledRgbaMIP2((char *)CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_0000003c,
                     in_stack_00000038,in_stack_00000034,in_stack_00000030);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled ripmap image with image-size framebuffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  writeTiledRgbaRIP1((char *)CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_0000003c,
                     in_stack_00000038,in_stack_00000034,in_stack_00000030);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled ripmap image with tile-size framebuffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  writeTiledRgbaRIP2(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                     in_stack_00000040);
  poVar1 = std::operator<<((ostream *)&std::cout,"reading tiled rgba file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  readTiledRgba1((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                 (Array2D<Imf_2_5::Rgba> *)CONCAT44(tileWidth,tileHeight),
                 (int *)CONCAT44(uVar4,uVar3),(int *)in_stack_ffffffffffffffe8);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_ffffffffffffff64,uVar2));
  return;
}

Assistant:

void
rgbaInterfaceTiledExamples ()
{
    cout << "\nRGBA tiled images\n" << endl;

    const int tw = 100;
    const int th = 75;
    int w = 600;
    int h = 400;

    cout << "writing tiled image with image-size framebuffer" << endl;

    Array2D<Rgba> pixels (h, w);
    drawImage3 (pixels, w, h, 0, w, 0, h, 0);
    writeTiledRgbaONE1 ("tiledrgba1.exr", &pixels[0][0], w, h, tw, th);

    cout << "writing tiled image with tile-size framebuffer" << endl;

    writeTiledRgbaONE2 ("tiledrgba2.exr", w, h, tw, th);

    cout << "writing tiled mipmap image with image-size framebuffer" << endl;

    writeTiledRgbaMIP1 ("tiledrgba3.exr", 512, 512, tw, th);

    cout << "writing tiled mipmap image with tile-size framebuffer" << endl;

    writeTiledRgbaMIP2 ("tiledrgba4.exr", 512, 512, tw, th);

    cout << "writing tiled ripmap image with image-size framebuffer" << endl;

    writeTiledRgbaRIP1 ("tiledrgba5.exr", 256, 256, tw, th);

    cout << "writing tiled ripmap image with tile-size framebuffer" << endl;

    writeTiledRgbaRIP2 ("tiledrgba6.exr", 256, 256, tw, th);

    cout << "reading tiled rgba file" << endl;

    readTiledRgba1 ("tiledrgba1.exr", pixels, w, h);
}